

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void jsonArrayStep(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  char c;
  JsonString *p;
  
  if ((short)ctx->pMem->flags < 0) {
    p = (JsonString *)ctx->pMem->z;
  }
  else {
    p = (JsonString *)createAggContext(ctx,0x88);
  }
  if (p == (JsonString *)0x0) {
    return;
  }
  if (p->zBuf == (char *)0x0) {
    p->pCtx = ctx;
    p->zBuf = p->zSpace;
    p->nAlloc = 100;
    p->nUsed = 0;
    p->bStatic = '\x01';
    p->bErr = '\0';
    c = '[';
  }
  else {
    c = ',';
    if (p->nUsed < 2) goto LAB_001bdebb;
  }
  jsonAppendChar(p,c);
LAB_001bdebb:
  p->pCtx = ctx;
  jsonAppendValue(p,*argv);
  return;
}

Assistant:

static void jsonArrayStep(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  JsonString *pStr;
  UNUSED_PARAMETER(argc);
  pStr = (JsonString*)sqlite3_aggregate_context(ctx, sizeof(*pStr));
  if( pStr ){
    if( pStr->zBuf==0 ){
      jsonInit(pStr, ctx);
      jsonAppendChar(pStr, '[');
    }else if( pStr->nUsed>1 ){
      jsonAppendChar(pStr, ',');
    }
    pStr->pCtx = ctx;
    jsonAppendValue(pStr, argv[0]);
  }
}